

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  bool bVar1;
  char *stamp_dir_00;
  cmMakefile *this_00;
  char *pcVar2;
  ulong uVar3;
  pointer ppVar4;
  reference pbVar5;
  ostream *poVar6;
  string local_6b8;
  string local_698;
  string local_678;
  allocator local_651;
  undefined1 local_650 [8];
  string stamp;
  string mod_lower;
  undefined1 local_5f0 [8];
  string mod_upper;
  _Self local_5c8;
  const_iterator i_2;
  undefined1 local_5b8 [8];
  string currentBinDir;
  cmGeneratedFileStream fcStream;
  string fcName;
  _Self local_328;
  const_iterator i_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *provides;
  cmGeneratedFileStream fiStream;
  string fiName;
  _Self local_a8;
  _Self local_a0;
  const_iterator i;
  ObjectInfoMap *objInfo;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  string mod_dir;
  cmMakefile *mf;
  char *stamp_dir;
  ostream *internalDepends_local;
  ostream *makeDepends_local;
  cmDependsFortran *this_local;
  
  LocateModules(this);
  stamp_dir_00 = (char *)std::__cxx11::string::c_str();
  this_00 = cmLocalGenerator::GetMakefile((this->super_cmDepends).LocalGenerator);
  mod_dir.field_2._8_8_ = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"CMAKE_Fortran_TARGET_MODULE_DIR",&local_79);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,pcVar2,(allocator *)((long)&objInfo + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&objInfo + 3));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory((this->super_cmDepends).LocalGenerator);
    std::__cxx11::string::operator=((string *)local_58,pcVar2);
  }
  i._M_node = (_Base_ptr)&this->Internal->ObjectInfo;
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
                *)i._M_node);
  do {
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
         ::end(i._M_node);
    bVar1 = std::operator!=(&local_a0,&local_a8);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&fiStream.field_0x240,(string *)&(this->super_cmDepends).TargetDirectory)
      ;
      std::__cxx11::string::operator+=((string *)&fiStream.field_0x240,"/fortran.internal");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&provides,pcVar2,false,None);
      std::operator<<((ostream *)&provides,"# The fortran modules provided by this target.\n");
      std::operator<<((ostream *)&provides,"provides\n");
      i_1._M_node = (_Base_ptr)this->Internal;
      local_328._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)i_1._M_node);
      while( true ) {
        fcName.field_2._8_8_ =
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)i_1._M_node);
        bVar1 = std::operator!=(&local_328,(_Self *)((long)&fcName.field_2 + 8));
        if (!bVar1) break;
        poVar6 = std::operator<<((ostream *)&provides," ");
        pbVar5 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_328);
        poVar6 = std::operator<<(poVar6,(string *)pbVar5);
        std::operator<<(poVar6,"\n");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_328);
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)i_1._M_node);
      if (!bVar1) {
        std::__cxx11::string::string
                  ((string *)&fcStream.field_0x240,
                   (string *)&(this->super_cmDepends).TargetDirectory);
        std::__cxx11::string::operator+=
                  ((string *)&fcStream.field_0x240,"/cmake_clean_Fortran.cmake");
        pcVar2 = (char *)std::__cxx11::string::c_str();
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)((long)&currentBinDir.field_2 + 8),pcVar2,false,None);
        std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),
                        "# Remove fortran modules provided by this target.\n");
        std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"FILE(REMOVE");
        pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory((this->super_cmDepends).LocalGenerator)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_5b8,pcVar2,(allocator *)((long)&i_2._M_node + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_2._M_node + 7));
        local_5c8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(i_1._M_node);
        while( true ) {
          mod_upper.field_2._8_8_ =
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)i_1._M_node);
          bVar1 = std::operator!=(&local_5c8,(_Self *)((long)&mod_upper.field_2 + 8));
          if (!bVar1) break;
          std::__cxx11::string::string((string *)local_5f0,(string *)local_58);
          std::__cxx11::string::operator+=((string *)local_5f0,"/");
          pbVar5 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_5c8);
          cmsys::SystemTools::UpperCase((string *)((long)&mod_lower.field_2 + 8),pbVar5);
          std::__cxx11::string::operator+=
                    ((string *)local_5f0,(string *)(mod_lower.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(mod_lower.field_2._M_local_buf + 8));
          std::__cxx11::string::operator+=((string *)local_5f0,".mod");
          std::__cxx11::string::string
                    ((string *)(stamp.field_2._M_local_buf + 8),(string *)local_58);
          std::__cxx11::string::operator+=((string *)(stamp.field_2._M_local_buf + 8),"/");
          pbVar5 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_5c8);
          std::__cxx11::string::operator+=
                    ((string *)(stamp.field_2._M_local_buf + 8),(string *)pbVar5);
          std::__cxx11::string::operator+=((string *)(stamp.field_2._M_local_buf + 8),".mod");
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_650,stamp_dir_00,&local_651);
          std::allocator<char>::~allocator((allocator<char> *)&local_651);
          std::__cxx11::string::operator+=((string *)local_650,"/");
          pbVar5 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_5c8);
          std::__cxx11::string::operator+=((string *)local_650,(string *)pbVar5);
          std::__cxx11::string::operator+=((string *)local_650,".mod.stamp");
          std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"\n");
          poVar6 = std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"  \"");
          MaybeConvertToRelativePath
                    (&local_678,this,(string *)local_5b8,(string *)((long)&stamp.field_2 + 8));
          poVar6 = std::operator<<(poVar6,(string *)&local_678);
          std::operator<<(poVar6,"\"\n");
          std::__cxx11::string::~string((string *)&local_678);
          poVar6 = std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"  \"");
          MaybeConvertToRelativePath(&local_698,this,(string *)local_5b8,(string *)local_5f0);
          poVar6 = std::operator<<(poVar6,(string *)&local_698);
          std::operator<<(poVar6,"\"\n");
          std::__cxx11::string::~string((string *)&local_698);
          poVar6 = std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"  \"");
          MaybeConvertToRelativePath(&local_6b8,this,(string *)local_5b8,(string *)local_650);
          poVar6 = std::operator<<(poVar6,(string *)&local_6b8);
          std::operator<<(poVar6,"\"\n");
          std::__cxx11::string::~string((string *)&local_6b8);
          std::__cxx11::string::~string((string *)local_650);
          std::__cxx11::string::~string((string *)(stamp.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_5f0);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_5c8);
        }
        std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"  )\n");
        std::__cxx11::string::~string((string *)local_5b8);
        cmGeneratedFileStream::~cmGeneratedFileStream
                  ((cmGeneratedFileStream *)((long)&currentBinDir.field_2 + 8));
        std::__cxx11::string::~string((string *)&fcStream.field_0x240);
      }
      this_local._7_1_ = true;
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&provides);
      std::__cxx11::string::~string((string *)&fiStream.field_0x240);
LAB_00826e84:
      std::__cxx11::string::~string((string *)local_58);
      return this_local._7_1_;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
    ::operator->(&local_a0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
             ::operator->(&local_a0);
    bVar1 = WriteDependenciesReal
                      (this,pcVar2,&ppVar4->second,(string *)local_58,stamp_dir_00,makeDepends,
                       internalDepends);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_00826e84;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
    ::operator++(&local_a0);
  } while( true );
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  this->LocateModules();

  // Get the directory in which stamp files will be stored.
  const char* stamp_dir = this->TargetDirectory.c_str();

  // Get the directory in which module files will be created.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::string mod_dir =
    mf->GetSafeDefinition("CMAKE_Fortran_TARGET_MODULE_DIR");
  if (mod_dir.empty()) {
    mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  }

  // Actually write dependencies to the streams.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (ObjectInfoMap::const_iterator i = objInfo.begin(); i != objInfo.end();
       ++i) {
    if (!this->WriteDependenciesReal(i->first.c_str(), i->second, mod_dir,
                                     stamp_dir, makeDepends,
                                     internalDepends)) {
      return false;
    }
  }

  // Store the list of modules provided by this target.
  std::string fiName = this->TargetDirectory;
  fiName += "/fortran.internal";
  cmGeneratedFileStream fiStream(fiName.c_str());
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::set<std::string>::const_iterator i = provides.begin();
       i != provides.end(); ++i) {
    fiStream << " " << *i << "\n";
  }

  // Create a script to clean the modules.
  if (!provides.empty()) {
    std::string fcName = this->TargetDirectory;
    fcName += "/cmake_clean_Fortran.cmake";
    cmGeneratedFileStream fcStream(fcName.c_str());
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    std::string currentBinDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::set<std::string>::const_iterator i = provides.begin();
         i != provides.end(); ++i) {
      std::string mod_upper = mod_dir;
      mod_upper += "/";
      mod_upper += cmSystemTools::UpperCase(*i);
      mod_upper += ".mod";
      std::string mod_lower = mod_dir;
      mod_lower += "/";
      mod_lower += *i;
      mod_lower += ".mod";
      std::string stamp = stamp_dir;
      stamp += "/";
      stamp += *i;
      stamp += ".mod.stamp";
      fcStream << "\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_lower)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_upper)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, stamp)
               << "\"\n";
    }
    fcStream << "  )\n";
  }
  return true;
}